

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O0

bool increasingSetOk(vector<int,_std::allocator<int>_> *set,HighsInt set_entry_lower,
                    HighsInt set_entry_upper,bool strict)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  HighsInt entry;
  HighsInt k;
  HighsInt previous_entry;
  bool check_bounds;
  HighsInt set_num_entries;
  int local_2c;
  int local_28;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
  if (in_ESI <= in_EDX) {
    local_28 = in_ESI;
    if ((in_CL & 1) != 0) {
      local_28 = in_ESI + -1;
    }
  }
  else {
    local_28 = -0x7fffffff;
  }
  local_2c = 0;
  while( true ) {
    if ((int)sVar2 <= local_2c) {
      return true;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_2c);
    iVar1 = *pvVar3;
    if ((in_CL & 1) == 0) {
      if (iVar1 < local_28) {
        return false;
      }
    }
    else if (iVar1 <= local_28) {
      return false;
    }
    if ((in_ESI <= in_EDX) && (in_EDX < iVar1)) break;
    local_2c = local_2c + 1;
    local_28 = iVar1;
  }
  return false;
}

Assistant:

bool increasingSetOk(const vector<HighsInt>& set,
                     const HighsInt set_entry_lower,
                     const HighsInt set_entry_upper, bool strict) {
  HighsInt set_num_entries = set.size();
  bool check_bounds = set_entry_lower <= set_entry_upper;
  HighsInt previous_entry;
  if (check_bounds) {
    if (strict) {
      previous_entry = set_entry_lower - 1;
    } else {
      previous_entry = set_entry_lower;
    }
  } else {
    previous_entry = -kHighsIInf;
  }
  for (HighsInt k = 0; k < set_num_entries; k++) {
    HighsInt entry = set[k];
    if (strict) {
      if (entry <= previous_entry) return false;
    } else {
      if (entry < previous_entry) return false;
    }
    if (check_bounds && entry > set_entry_upper) return false;
    previous_entry = entry;
  }
  return true;
}